

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O0

wchar_t borg_wield_slot(borg_item_conflict *item)

{
  borg_item_conflict *item_local;
  
  switch(item->tval) {
  case '\x05':
    item_local._4_4_ = (uint)z_info->pack_size + L'\x01';
    break;
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
    item_local._4_4_ = (wchar_t)z_info->pack_size;
    break;
  case '\n':
    item_local._4_4_ = (uint)z_info->pack_size + L'\v';
    break;
  case '\v':
    item_local._4_4_ = (uint)z_info->pack_size + L'\n';
    break;
  case '\f':
  case '\r':
    item_local._4_4_ = (uint)z_info->pack_size + L'\t';
    break;
  case '\x0e':
    item_local._4_4_ = (uint)z_info->pack_size + L'\b';
    break;
  case '\x0f':
    item_local._4_4_ = (uint)z_info->pack_size + L'\a';
    break;
  case '\x10':
  case '\x11':
  case '\x12':
    item_local._4_4_ = (uint)z_info->pack_size + L'\x06';
    break;
  case '\x13':
    item_local._4_4_ = (uint)z_info->pack_size + L'\x05';
    break;
  case '\x14':
    item_local._4_4_ = (uint)z_info->pack_size + L'\x04';
    break;
  case '\x15':
    item_local._4_4_ = (uint)z_info->pack_size + L'\x03';
    break;
  default:
    item_local._4_4_ = L'\xffffffff';
  }
  return item_local._4_4_;
}

Assistant:

int borg_wield_slot(const borg_item *item)
{
    switch (item->tval) {
    case TV_SWORD:
    case TV_POLEARM:
    case TV_HAFTED:
    case TV_DIGGING:
        return INVEN_WIELD;

    case TV_DRAG_ARMOR:
    case TV_HARD_ARMOR:
    case TV_SOFT_ARMOR:
        return INVEN_BODY;

    case TV_SHIELD:
        return INVEN_ARM;

    case TV_CROWN:
    case TV_HELM:
        return INVEN_HEAD;

    case TV_BOW:
        return INVEN_BOW;
    case TV_RING:
        return INVEN_LEFT;
    case TV_AMULET:
        return INVEN_NECK;
    case TV_LIGHT:
        return INVEN_LIGHT;
    case TV_CLOAK:
        return INVEN_OUTER;
    case TV_GLOVES:
        return INVEN_HANDS;
    case TV_BOOTS:
        return INVEN_FEET;
    }

    /* No slot available */
    return -1;
}